

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void predict_iforest<double,int>
               (double *numeric_data,int *categ_data,bool is_col_major,size_t ld_numeric,
               size_t ld_categ,double *Xc,int *Xc_ind,int *Xc_indptr,double *Xr,int *Xr_ind,
               int *Xr_indptr,size_t nrows,int nthreads,bool standardize,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *output_depths,int *tree_num,
               double *per_tree_depths,TreesIndexer *indexer)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  byte in_DL;
  long in_RSI;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  pointer pdVar12;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  long in_stack_00000010;
  long in_stack_00000028;
  ulong in_stack_00000030;
  byte in_stack_00000040;
  PredictionData<double,_int> *in_stack_00000048;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_stack_00000050;
  ImputedData<int,_double> *in_stack_00000058;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_stack_00000060;
  PredictionData<double,_int> *in_stack_00000068;
  IsoForest *in_stack_00000070;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_00000078;
  int *in_stack_00000090;
  double *in_stack_00000098;
  size_t in_stack_000000a0;
  size_t row_13;
  size_t *mapping;
  size_t tree_6;
  size_t ntrees_2;
  size_t ix;
  size_t ntrees_1;
  size_t row_12;
  size_t row_11;
  size_t row_10;
  size_t row_9;
  size_t row_8;
  size_t row_7;
  size_t row_6;
  bool is_bdens2;
  bool is_bdens;
  bool is_bratio;
  bool is_density;
  double depth_divisor;
  double ntrees;
  size_t tree_5;
  double score_5;
  size_t row_5;
  size_t tree_4;
  double score_4;
  size_t row_4;
  size_t tree_3;
  double score_3;
  size_t row_3;
  size_t tree_2;
  double score_2;
  size_t row_2;
  exception_ptr ex;
  bool threw_exception;
  size_t tree_1;
  double score_1;
  size_t row_1;
  size_t tree;
  double score;
  size_t row;
  int nthreads_orig;
  PredictionData<double,_int> prediction_data;
  ImputedData<int,_double> *in_stack_fffffffffffffc48;
  double **in_stack_fffffffffffffc50;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_fffffffffffffc60;
  double *in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc71;
  undefined1 in_stack_fffffffffffffc72;
  undefined1 in_stack_fffffffffffffc73;
  undefined1 in_stack_fffffffffffffc74;
  undefined1 in_stack_fffffffffffffc75;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  double *in_stack_fffffffffffffc78;
  double *in_stack_fffffffffffffc80;
  IsoForest *in_stack_fffffffffffffc88;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_fffffffffffffc90;
  double *in_stack_fffffffffffffc98;
  double *in_stack_fffffffffffffca0;
  ExtIsoForest *in_stack_fffffffffffffca8;
  PredictionData<double,_int> *in_stack_fffffffffffffcb0;
  ExtIsoForest *in_stack_fffffffffffffcb8;
  double **in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcf8;
  int *in_stack_fffffffffffffd00;
  double *in_stack_fffffffffffffd08;
  PredictionData<double,_int> *in_stack_fffffffffffffd10;
  IsoForest *in_stack_fffffffffffffd18;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_fffffffffffffd20;
  size_t in_stack_fffffffffffffd30;
  double **in_stack_fffffffffffffd60;
  int nthreads_00;
  ImputedData<int,_double> *in_stack_fffffffffffffd68;
  ImputedData<int,_double> *in_stack_fffffffffffffd70;
  ExtIsoForest *in_stack_fffffffffffffd78;
  PredictionData<double,_int> *in_stack_fffffffffffffd80;
  ExtIsoForest *in_stack_fffffffffffffd88;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_fffffffffffffd90;
  ExtIsoForest *in_stack_fffffffffffffd98;
  IsoForest *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  PredictionData<double,_int> *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdc0;
  ulong local_1e0;
  ulong local_1d0;
  ulong local_1c0;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  size_type local_160;
  ulong local_150;
  size_type local_148;
  ulong local_138;
  ulong local_130;
  ulong local_120;
  undefined1 local_118 [20];
  undefined4 local_104;
  undefined8 local_100;
  ulong local_f8;
  pointer local_f0;
  ulong local_e8;
  exception_ptr local_e0;
  byte local_d1;
  ulong local_d0;
  pointer local_c8;
  ulong local_c0;
  ulong local_b8;
  pointer local_b0;
  ulong local_a8;
  byte local_80;
  byte local_31;
  byte local_11;
  long local_10;
  
  local_80 = in_DL & 1;
  local_31 = in_stack_00000040 & 1;
  if (in_stack_00000030 == 0) {
    return;
  }
  local_11 = local_80;
  local_10 = in_RSI;
  if ((in_stack_00000010 == 0) || ((in_RSI != 0 && (local_80 == 0)))) {
    if (in_stack_00000048 == (PredictionData<double,_int> *)0x0) {
      if ((((*(int *)&in_stack_00000050[1].
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish == 0) && (in_RSI == 0)) &&
          (in_stack_00000010 == 0)) &&
         ((in_stack_00000028 == 0 &&
          (((ulong)in_stack_00000050[2].
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0)))) {
        if ((local_80 == 0) || (in_stack_00000030 < 2)) {
          for (local_138 = 0; local_138 < in_stack_00000030; local_138 = local_138 + 1) {
            local_148 = 0;
            while (sVar3 = local_148,
                  sVar2 = std::
                          vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ::size(in_stack_00000050), sVar3 < sVar2) {
              std::
              vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              ::operator[](in_stack_00000050,local_148);
              if (in_stack_00000068 != (PredictionData<double,_int> *)0x0) {
                in_stack_fffffffffffffcc0 = &in_stack_00000068->numeric_data + local_148;
                std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::size(in_stack_00000050);
              }
              traverse_hplane_fast_rowmajor<double,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_stack_fffffffffffffcb0,
                         in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                         in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90,
                         (double *)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffcc0);
              local_148 = local_148 + 1;
            }
            (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start)[local_138] = (pointer)0x0;
          }
        }
        else {
          for (local_120 = 0; local_120 < in_stack_00000030; local_120 = local_120 + 1) {
            for (local_130 = 0;
                sVar3 = std::
                        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ::size(in_stack_00000050), local_130 < sVar3; local_130 = local_130 + 1) {
              std::
              vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              ::operator[](in_stack_00000050,local_130);
              if (in_stack_00000068 != (PredictionData<double,_int> *)0x0) {
                std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::size(in_stack_00000050);
              }
              traverse_hplane_fast_colmajor<PredictionData<double,int>,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_stack_fffffffffffffcc0,
                         in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                         (double *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0,
                         in_stack_fffffffffffffc98,in_stack_fffffffffffffcd0);
            }
            (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start)[local_120] = (pointer)0x0;
          }
        }
      }
      else {
        for (local_150 = 0; local_150 < in_stack_00000030; local_150 = local_150 + 1) {
          local_160 = 0;
          while (sVar3 = local_160,
                sVar2 = std::
                        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ::size(in_stack_00000050), sVar3 < sVar2) {
            std::
            vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            ::operator[](in_stack_00000050,local_160);
            if (in_stack_00000068 != (PredictionData<double,_int> *)0x0) {
              std::
              vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              ::size(in_stack_00000050);
            }
            traverse_hplane<PredictionData<double,int>,int,ImputedData<int,double>>
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,(double *)in_stack_fffffffffffffd78,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffda0,
                       in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffdb0);
            local_160 = local_160 + 1;
          }
          (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start)[local_150] = (pointer)0x0;
        }
      }
    }
    else if ((((int)in_stack_00000048->ncols_numeric == 0) &&
             (((*(int *)&in_stack_00000048->is_col_major != 0 ||
               (*(int *)&in_stack_00000048->field_0x1c == 0x29)) || (in_RSI == 0)))) &&
            (((in_stack_00000010 == 0 && (in_stack_00000028 == 0)) &&
             (((ulong)in_stack_00000048->Xc_indptr & 1) == 0)))) {
      if ((in_RSI == 0) && ((in_stack_00000030 == 1 || (local_80 == 0)))) {
        for (local_a8 = 0; local_a8 < in_stack_00000030; local_a8 = local_a8 + 1) {
          local_b0 = (pointer)0x0;
          for (local_b8 = 0; uVar4 = local_b8,
              sVar3 = std::
                      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              *)in_stack_00000048), uVar4 < sVar3; local_b8 = local_b8 + 1) {
            std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::operator[]((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          *)in_stack_00000048,local_b8);
            if (in_stack_00000068 != (PredictionData<double,_int> *)0x0) {
              std::
              vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      *)in_stack_00000048);
            }
            traverse_itree_fast<double,int>
                      (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80
                       ,in_stack_fffffffffffffc78,
                       (int *)CONCAT17(in_stack_fffffffffffffc77,
                                       CONCAT16(in_stack_fffffffffffffc76,
                                                CONCAT15(in_stack_fffffffffffffc75,
                                                         CONCAT14(in_stack_fffffffffffffc74,
                                                                  CONCAT13(in_stack_fffffffffffffc73
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffc72,
                                                  CONCAT11(in_stack_fffffffffffffc71,
                                                           in_stack_fffffffffffffc70))))))),
                       in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffca0);
          }
          (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start)[local_a8] = local_b0;
        }
      }
      else {
        for (local_c0 = 0; local_c0 < in_stack_00000030; local_c0 = local_c0 + 1) {
          local_c8 = (pointer)0x0;
          for (local_d0 = 0; uVar4 = local_d0,
              sVar3 = std::
                      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              *)in_stack_00000048), uVar4 < sVar3; local_d0 = local_d0 + 1) {
            std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::operator[]((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          *)in_stack_00000048,local_d0);
            if (in_stack_00000068 != (PredictionData<double,_int> *)0x0) {
              std::
              vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      *)in_stack_00000048);
            }
            traverse_itree_no_recurse<PredictionData<double,int>,int>
                      (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10
                       ,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                       in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30);
          }
          (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start)[local_c0] = local_c8;
        }
      }
    }
    else {
      local_d1 = 0;
      std::__exception_ptr::exception_ptr::exception_ptr(&local_e0,(nullptr_t)0x0);
      for (local_e8 = 0; local_e8 < in_stack_00000030; local_e8 = local_e8 + 1) {
        if ((local_d1 & 1) == 0) {
          local_f0 = (pointer)0x0;
          local_f8 = 0;
          while (uVar4 = local_f8,
                sVar3 = std::
                        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                *)in_stack_00000048), uVar4 < sVar3) {
            in_stack_fffffffffffffd78 =
                 (ExtIsoForest *)
                 std::
                 vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ::operator[]((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                               *)in_stack_00000048,local_f8);
            uVar1 = local_e8;
            uVar4 = local_f8;
            if (in_stack_00000060 == (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0) {
              in_stack_fffffffffffffc48 = (ImputedData<int,_double> *)0x0;
            }
            else {
              in_stack_fffffffffffffc48 =
                   (ImputedData<int,_double> *)
                   ((long)&(in_stack_00000060->
                           super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                           super__Vector_impl_data._M_start + in_stack_00000030 * local_f8 * 4);
            }
            in_stack_fffffffffffffd70 = in_stack_fffffffffffffc48;
            in_stack_fffffffffffffd80 = in_stack_00000048;
            if (in_stack_00000068 == (PredictionData<double,_int> *)0x0) {
              in_stack_fffffffffffffc50 = (double **)0x0;
            }
            else {
              sVar3 = std::
                      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              *)in_stack_00000048);
              in_stack_fffffffffffffc50 = &in_stack_00000068->numeric_data + uVar4 + uVar1 * sVar3;
            }
            in_stack_fffffffffffffd60 = in_stack_fffffffffffffc50;
            in_stack_fffffffffffffd68 = in_stack_fffffffffffffc48;
            dVar10 = traverse_itree<PredictionData<double,int>,int,ImputedData<int,double>>
                               (in_stack_00000078,in_stack_00000070,in_stack_00000068,
                                in_stack_00000060,in_stack_00000058,(double)in_stack_00000050,
                                (size_t)in_stack_00000048,in_stack_00000090,in_stack_00000098,
                                in_stack_000000a0);
            local_f0 = (pointer)(dVar10 + (double)local_f0);
            local_f8 = local_f8 + 1;
          }
          (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start)[local_e8] = local_f0;
        }
      }
      if ((local_d1 & 1) != 0) {
        std::__exception_ptr::exception_ptr::exception_ptr
                  ((exception_ptr *)in_stack_fffffffffffffc50,
                   (exception_ptr *)in_stack_fffffffffffffc48);
        auVar16 = std::rethrow_exception((exception_ptr)local_118);
        local_104 = auVar16._8_4_;
        local_100 = auVar16._0_8_;
        std::__exception_ptr::exception_ptr::~exception_ptr
                  ((exception_ptr *)in_stack_fffffffffffffc50);
        std::__exception_ptr::exception_ptr::~exception_ptr
                  ((exception_ptr *)in_stack_fffffffffffffc50);
        _Unwind_Resume(local_100);
      }
      std::__exception_ptr::exception_ptr::~exception_ptr
                ((exception_ptr *)in_stack_fffffffffffffc50);
    }
  }
  else {
    batched_csc_predict<double,int>
              (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (double *)in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88,
               in_stack_fffffffffffffdc0);
  }
  if (in_stack_00000048 == (PredictionData<double,_int> *)0x0) {
    sVar3 = std::
            vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            ::size(in_stack_00000050);
    auVar15._8_4_ = (int)(sVar3 >> 0x20);
    auVar15._0_8_ = sVar3;
    auVar15._12_4_ = 0x45300000;
    dVar10 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
    dVar11 = dVar10 * (double)in_stack_00000050[1].
                              super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_001b9a9e:
    bVar6 = false;
    if (in_stack_00000050 !=
        (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
         *)0x0) {
      bVar6 = *(int *)((long)&in_stack_00000050[1].
                              super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4) == 0x5c;
    }
  }
  else {
    sVar3 = std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    *)in_stack_00000048);
    auVar14._8_4_ = (int)(sVar3 >> 0x20);
    auVar14._0_8_ = sVar3;
    auVar14._12_4_ = 0x45300000;
    dVar10 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
    dVar11 = dVar10 * (double)in_stack_00000048->ncols_categ;
    bVar6 = true;
    if (*(int *)((long)&in_stack_00000048->ncols_numeric + 4) != 0x5c) goto LAB_001b9a9e;
  }
  if (((in_stack_00000048 == (PredictionData<double,_int> *)0x0) ||
      (bVar7 = true, *(int *)((long)&in_stack_00000048->ncols_numeric + 4) != 0x5f)) &&
     (bVar7 = false,
     in_stack_00000050 !=
     (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      *)0x0)) {
    bVar7 = *(int *)((long)&in_stack_00000050[1].
                            super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) == 0x5f;
  }
  if (((in_stack_00000048 == (PredictionData<double,_int> *)0x0) ||
      (bVar8 = true, *(int *)((long)&in_stack_00000048->ncols_numeric + 4) != 0x5e)) &&
     (bVar8 = false,
     in_stack_00000050 !=
     (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      *)0x0)) {
    bVar8 = *(int *)((long)&in_stack_00000050[1].
                            super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) == 0x5e;
  }
  if (((in_stack_00000048 == (PredictionData<double,_int> *)0x0) ||
      (bVar9 = true, *(int *)((long)&in_stack_00000048->ncols_numeric + 4) != 0x60)) &&
     (bVar9 = false,
     in_stack_00000050 !=
     (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      *)0x0)) {
    bVar9 = *(int *)((long)&in_stack_00000050[1].
                            super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) == 0x60;
  }
  if ((local_31 & 1) == 0) {
    if (((bVar6) || (bVar8)) || (bVar9)) {
      for (local_1a0 = 0; local_1a0 < in_stack_00000030; local_1a0 = local_1a0 + 1) {
        pdVar12 = (pointer)exp((double)(&(in_stack_00000058->num_sum).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start)[local_1a0] / dVar10);
        (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start)[local_1a0] = pdVar12;
      }
    }
    else if (bVar7) {
      for (local_1a8 = 0; local_1a8 < in_stack_00000030; local_1a8 = local_1a8 + 1) {
        (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start)[local_1a8] =
             (pointer)((double)(&(in_stack_00000058->num_sum).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start)[local_1a8] / -dVar10);
      }
    }
    else {
      for (local_1b0 = 0; local_1b0 < in_stack_00000030; local_1b0 = local_1b0 + 1) {
        (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start)[local_1b0] =
             (pointer)((double)(&(in_stack_00000058->num_sum).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start)[local_1b0] / dVar10);
      }
    }
  }
  else if ((bVar6) || (bVar9)) {
    for (local_180 = 0; local_180 < in_stack_00000030; local_180 = local_180 + 1) {
      (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start)[local_180] =
           (pointer)((double)(&(in_stack_00000058->num_sum).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start)[local_180] / -dVar10);
    }
  }
  else if (bVar8) {
    for (local_188 = 0; local_188 < in_stack_00000030; local_188 = local_188 + 1) {
      dVar11 = exp((double)(&(in_stack_00000058->num_sum).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start)[local_188] / dVar10);
      (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start)[local_188] = (pointer)((ulong)dVar11 ^ 0x8000000000000000)
      ;
    }
  }
  else if (bVar7) {
    for (local_190 = 0; local_190 < in_stack_00000030; local_190 = local_190 + 1) {
      (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start)[local_190] =
           (pointer)((double)(&(in_stack_00000058->num_sum).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start)[local_190] / dVar10);
    }
  }
  else {
    for (local_198 = 0; local_198 < in_stack_00000030; local_198 = local_198 + 1) {
      pdVar12 = (pointer)exp2(-(double)(&(in_stack_00000058->num_sum).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start)[local_198] / dVar11);
      (&(in_stack_00000058->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start)[local_198] = pdVar12;
    }
  }
  nthreads_00 = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  if ((in_stack_00000068 != (PredictionData<double,_int> *)0x0) && (((bVar6 || (bVar8)) || (bVar9)))
     ) {
    if (in_stack_00000048 == (PredictionData<double,_int> *)0x0) {
      sVar3 = std::
              vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              ::size(in_stack_00000050);
    }
    else {
      sVar3 = std::
              vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      *)in_stack_00000048);
    }
    for (local_1c0 = 0; nthreads_00 = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
        local_1c0 < in_stack_00000030 * sVar3; local_1c0 = local_1c0 + 1) {
      pdVar13 = (double *)exp((double)(&in_stack_00000068->numeric_data)[local_1c0]);
      (&in_stack_00000068->numeric_data)[local_1c0] = pdVar13;
    }
  }
  if (in_stack_00000060 == (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0) {
    return;
  }
  if ((in_stack_00000070 == (IsoForest *)0x0) ||
     (bVar6 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                        (in_stack_fffffffffffffc60), bVar6)) {
LAB_001ba243:
    remap_terminal_trees<PredictionData<double,int>,int>
              ((IsoForest *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (PredictionData<double,_int> *)in_stack_fffffffffffffd70,
               (int *)in_stack_fffffffffffffd68,nthreads_00);
  }
  else {
    if (in_stack_00000048 == (PredictionData<double,_int> *)0x0) {
      uVar4 = std::
              vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              ::size(in_stack_00000050);
    }
    else {
      uVar4 = std::
              vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ::size((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      *)in_stack_00000048);
      if (((int)in_stack_00000048->ncols_numeric == 0x15) ||
         (((*(int *)&in_stack_00000048->is_col_major == 0 &&
           (*(int *)&in_stack_00000048->field_0x1c == 0)) && (local_10 != 0)))) goto LAB_001ba243;
    }
    for (local_1d0 = 0; local_1d0 < uVar4; local_1d0 = local_1d0 + 1) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)in_stack_00000070,
                 local_1d0);
      puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ba188);
      for (local_1e0 = 0; local_1e0 < in_stack_00000030; local_1e0 = local_1e0 + 1) {
        *(int *)((long)&(in_stack_00000060->
                        super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                        super__Vector_impl_data._M_start +
                (local_1e0 + local_1d0 * in_stack_00000030) * 4) =
             (int)puVar5[*(int *)((long)&(in_stack_00000060->
                                         super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 (local_1e0 + local_1d0 * in_stack_00000030) * 4)];
      }
    }
  }
  return;
}

Assistant:

void predict_iforest(real_t *restrict numeric_data, int *restrict categ_data,
                     bool is_col_major, size_t ld_numeric, size_t ld_categ,
                     real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double *restrict output_depths,   sparse_ix *restrict tree_num,
                     double *restrict per_tree_depths,
                     TreesIndexer *indexer)
{
    if (unlikely(!nrows)) return;

    /* put data in a struct for passing it in fewer lines */
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, ld_numeric, ld_categ,
                                      Xc, Xc_ind, Xc_indptr,
                                      Xr, Xr_ind, Xr_indptr};

    int nthreads_orig = nthreads;
    if ((size_t)nthreads > nrows)
        nthreads = nrows;

    /* For batch predictions of sparse CSC, will take a specialized route */
    if (prediction_data.Xc_indptr != NULL && (prediction_data.categ_data == NULL || prediction_data.is_col_major))
    {
        batched_csc_predict(prediction_data, nthreads_orig,
                            model_outputs, model_outputs_ext,
                            output_depths, tree_num,
                            per_tree_depths);
    }

    /* Regular case (no specialized CSC route) */
    else if (model_outputs != NULL)
    {
        if (
            model_outputs->missing_action == Fail &&
            (model_outputs->new_cat_action != Weighted || model_outputs->cat_split_type == SingleCateg || prediction_data.categ_data == NULL) &&
            prediction_data.Xc_indptr == NULL && prediction_data.Xr_indptr == NULL &&
            !model_outputs->has_range_penalty
            )
        {
            if (prediction_data.categ_data == NULL && (nrows == 1 || !prediction_data.is_col_major))
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_fast(model_outputs->trees[tree],
                                            *model_outputs,
                                            prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                            score,
                                            (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                            (per_tree_depths == NULL)?
                                                NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                            (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_no_recurse(model_outputs->trees[tree],
                                                  *model_outputs,
                                                  prediction_data,
                                                  score,
                                                  (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                  (per_tree_depths == NULL)?
                                                      NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                  (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            bool threw_exception = false;
            std::exception_ptr ex = NULL;

            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths, threw_exception, ex)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                if (threw_exception) continue;
                double score = 0;
                try
                {
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        score += traverse_itree(model_outputs->trees[tree],
                                                *model_outputs,
                                                prediction_data,
                                                (std::vector<ImputeNode>*)NULL,
                                                (ImputedData<sparse_ix, double>*)NULL,
                                                (double)0,
                                                (size_t) row,
                                                (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                (per_tree_depths == NULL)?
                                                    NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                (size_t) 0);
                    }
                    output_depths[row] = score;
                }
                catch (...)
                {
                    #pragma omp critical
                    {
                        if (!threw_exception)
                        {
                            threw_exception = true;
                            ex = std::current_exception();
                        }
                    }
                }
            }

            if (threw_exception)
                std::rethrow_exception(ex);
        }
    }
    

    else
    {
        if (
            model_outputs_ext->missing_action == Fail &&
            prediction_data.categ_data == NULL &&
            prediction_data.Xc_indptr == NULL &&
            prediction_data.Xr_indptr == NULL &&
            !model_outputs_ext->has_range_penalty
            )
        {
            if (prediction_data.is_col_major && nrows > 1)
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_colmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_rowmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                double score = 0;
                for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                {
                    traverse_hplane(model_outputs_ext->hplanes[tree],
                                    *model_outputs_ext,
                                    prediction_data,
                                    score,
                                    (std::vector<ImputeNode>*)NULL,
                                    (ImputedData<sparse_ix, double>*)NULL,
                                    (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                    (per_tree_depths == NULL)?
                                        NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                    (size_t) row);
                }
                output_depths[row] = score;
            }
        }
    }

    /* translate sum-of-depths to outlier score */
    double ntrees, depth_divisor;
    if (model_outputs != NULL)
    {
        ntrees = (double) model_outputs->trees.size();
        depth_divisor = ntrees * (model_outputs->exp_avg_depth);
    }

    else
    {
        ntrees = (double) model_outputs_ext->hplanes.size();
        depth_divisor = ntrees * (model_outputs_ext->exp_avg_depth);
    }

    
    /* for density and boxed_ratio, each tree will have 'log(d)'' instead of 'd' */
    bool is_density = (model_outputs != NULL && model_outputs->scoring_metric == Density) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == Density);
    bool is_bratio  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedRatio) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedRatio);
    bool is_bdens   = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity);
    bool is_bdens2  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity2) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity2);

    if (standardize)
    {
        if (is_density || is_bdens2)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else if (is_bdens)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = -std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = output_depths[row] / ntrees;
        }

        else
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp2( - output_depths[row] / depth_divisor );
        }
    }

    else
    {
        if (is_density || is_bdens || is_bdens2)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }
    }

    if (per_tree_depths != NULL && (is_density || is_bdens || is_bdens2))
    {
        size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < nrows*ntrees; ix++)
            per_tree_depths[ix] = std::exp(per_tree_depths[ix]);
    }


    /* re-map tree numbers to start at zero (if predicting tree numbers) */
    /* Note: usually this type of 'prediction' is not required,
       thus this mapping is not stored in the model objects so as to
       save memory */
    if (tree_num != NULL)
    {
        if (indexer != NULL && !indexer->indices.empty())
        {
            size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
            if (model_outputs != NULL)
            {
                if (model_outputs->missing_action == Divide)
                    goto manual_remap;
                if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL)
                    goto manual_remap;
            }

            for (size_t tree = 0; tree < ntrees; tree++)
            {
                size_t *restrict mapping = indexer->indices[tree].terminal_node_mappings.data();
                for (size_t row = 0; row < nrows; row++)
                {
                    tree_num[row + tree*nrows] = mapping[tree_num[row + tree*nrows]];
                }
            }
        }

        else
        {
            manual_remap:
            remap_terminal_trees(model_outputs, model_outputs_ext,
                                 prediction_data, tree_num, nthreads);
        }
    }
}